

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

int pybind11::detail::generic_type::init(EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  string local_48 [8];
  string msg;
  PyTypeObject *type;
  PyObject *param_2_local;
  PyObject *param_1_local;
  void *self_local;
  
  msg.field_2._8_8_ = *(undefined8 *)(ctx + 8);
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::operator+=(local_48,*(char **)(msg.field_2._8_8_ + 0x18));
  std::__cxx11::string::operator+=(local_48,": No constructor defined!");
  uVar1 = _PyExc_TypeError;
  uVar2 = std::__cxx11::string::c_str();
  PyErr_SetString(uVar1,uVar2);
  std::__cxx11::string::~string(local_48);
  return -1;
}

Assistant:

static int init(void *self, PyObject *, PyObject *) {
        PyTypeObject *type = Py_TYPE(self);
        std::string msg;
#if defined(PYPY_VERSION)
        msg += handle((PyObject *) type).attr("__module__").cast<std::string>() + ".";
#endif
        msg += type->tp_name;
        msg += ": No constructor defined!";
        PyErr_SetString(PyExc_TypeError, msg.c_str());
        return -1;
    }